

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

DFA * __thiscall re2::Prog::GetDFA(Prog *this,MatchKind kind)

{
  int in_ESI;
  once_flag *in_RDI;
  Prog **in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  DFA *local_8;
  
  if (in_ESI == 0) {
    std::call_once<re2::Prog::GetDFA(re2::Prog::MatchKind)::__0,re2::Prog*>
              (in_RDI,(anon_class_1_0_00000001 *)(ulong)in_stack_ffffffffffffffe8,(Prog **)in_RDI);
    local_8 = *(DFA **)(in_RDI + 0x20);
  }
  else if (in_ESI == 3) {
    std::call_once<re2::Prog::GetDFA(re2::Prog::MatchKind)::__1,re2::Prog*>
              (in_RDI,(anon_class_1_0_00000001 *)CONCAT44(3,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0);
    local_8 = *(DFA **)(in_RDI + 0x20);
  }
  else {
    std::call_once<re2::Prog::GetDFA(re2::Prog::MatchKind)::__2,re2::Prog*>
              (in_RDI,(anon_class_1_0_00000001 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0);
    local_8 = *(DFA **)(in_RDI + 0x22);
  }
  return local_8;
}

Assistant:

DFA* Prog::GetDFA(MatchKind kind) {
  // For a forward DFA, half the memory goes to each DFA.
  // However, if it is a "many match" DFA, then there is
  // no counterpart with which the memory must be shared.
  //
  // For a reverse DFA, all the memory goes to the
  // "longest match" DFA, because RE2 never does reverse
  // "first match" searches.
  if (kind == kFirstMatch) {
    std::call_once(dfa_first_once_, [](Prog* prog) {
      prog->dfa_first_ = new DFA(prog, kFirstMatch, prog->dfa_mem_ / 2);
    }, this);
    return dfa_first_;
  } else if (kind == kManyMatch) {
    std::call_once(dfa_first_once_, [](Prog* prog) {
      prog->dfa_first_ = new DFA(prog, kManyMatch, prog->dfa_mem_);
    }, this);
    return dfa_first_;
  } else {
    std::call_once(dfa_longest_once_, [](Prog* prog) {
      if (!prog->reversed_)
        prog->dfa_longest_ = new DFA(prog, kLongestMatch, prog->dfa_mem_ / 2);
      else
        prog->dfa_longest_ = new DFA(prog, kLongestMatch, prog->dfa_mem_);
    }, this);
    return dfa_longest_;
  }
}